

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::ObjectToNativeArray<Js::JavascriptNativeIntArray>
               (JavascriptNativeIntArray *arrayObject,JsNativeValueType valueType,UINT length,
               UINT elementSize,byte *buffer,ScriptContext *scriptContext)

{
  code *pcVar1;
  byte bVar2;
  uint8 uVar3;
  bool bVar4;
  int16 iVar5;
  uint16 uVar6;
  uint32 uVar7;
  int32 iVar8;
  int iVar9;
  charcount_t cVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  unsigned_long uVar14;
  Var pvVar15;
  JavascriptString *this;
  undefined4 extraout_var;
  undefined4 *puVar16;
  float fVar17;
  double dVar18;
  JavascriptString *string;
  uint local_68;
  UINT i_10;
  UINT i_9;
  UINT i_8;
  UINT i_7;
  UINT i_6;
  UINT i_5;
  UINT i_4;
  UINT i_3;
  UINT i_2;
  UINT i_1;
  UINT i;
  uint64 allocSize;
  Var element;
  ScriptContext *scriptContext_local;
  byte *buffer_local;
  UINT elementSize_local;
  UINT length_local;
  JsNativeValueType valueType_local;
  JavascriptNativeIntArray *arrayObject_local;
  
  uVar7 = UInt32Math::Mul(length,elementSize);
  uVar11 = (ulong)uVar7;
  switch(valueType) {
  case JsInt8Type:
    if (elementSize != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2904,"(elementSize == sizeof(int8))",
                                  "elementSize == sizeof(int8)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_2 = 0; i_2 < length; i_2 = i_2 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_2,scriptContext);
      if (uVar11 < i_2 + 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2908,"((i + 1) * sizeof(int8) <= allocSize)",
                                    "(i + 1) * sizeof(int8) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      bVar2 = JavascriptConversion::ToInt8(pvVar15,scriptContext);
      buffer[i_2] = bVar2;
    }
    break;
  case JsUint8Type:
    if (elementSize != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x290e,"(elementSize == sizeof(uint8))",
                                  "elementSize == sizeof(uint8)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_3 = 0; i_3 < length; i_3 = i_3 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_3,scriptContext);
      if (uVar11 < i_3 + 1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2912,"((i + 1) * sizeof(uint8) <= allocSize)",
                                    "(i + 1) * sizeof(uint8) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      uVar3 = JavascriptConversion::ToUInt8(pvVar15,scriptContext);
      buffer[i_3] = uVar3;
    }
    break;
  case JsInt16Type:
    if (elementSize != 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2917,"(elementSize == sizeof(int16))",
                                  "elementSize == sizeof(int16)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_4,scriptContext);
      uVar12 = (ulong)(i_4 + 1) * 2;
      if (uVar11 <= uVar12 && uVar12 - uVar11 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x291b,"((i + 1) * sizeof(int16) <= allocSize)",
                                    "(i + 1) * sizeof(int16) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      iVar5 = JavascriptConversion::ToInt16(pvVar15,scriptContext);
      *(int16 *)(buffer + (ulong)i_4 * 2) = iVar5;
    }
    break;
  case JsUint16Type:
    if (elementSize != 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2920,"(elementSize == sizeof(uint16))",
                                  "elementSize == sizeof(uint16)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_5 = 0; i_5 < length; i_5 = i_5 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_5,scriptContext);
      uVar12 = (ulong)(i_5 + 1) * 2;
      if (uVar11 <= uVar12 && uVar12 - uVar11 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2924,"((i + 1) * sizeof(uint16) <= allocSize)",
                                    "(i + 1) * sizeof(uint16) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      uVar6 = JavascriptConversion::ToUInt16(pvVar15,scriptContext);
      *(uint16 *)(buffer + (ulong)i_5 * 2) = uVar6;
    }
    break;
  case JsInt32Type:
    if (elementSize != 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2929,"(elementSize == sizeof(int32))",
                                  "elementSize == sizeof(int32)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_6 = 0; i_6 < length; i_6 = i_6 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_6,scriptContext);
      if (uVar11 < (ulong)(i_6 + 1) << 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x292d,"((i + 1) * sizeof(int32) <= allocSize)",
                                    "(i + 1) * sizeof(int32) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      iVar8 = JavascriptConversion::ToInt32(pvVar15,scriptContext);
      *(int32 *)(buffer + (ulong)i_6 * 4) = iVar8;
    }
    break;
  case JsUint32Type:
    if (elementSize != 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2932,"(elementSize == sizeof(uint32))",
                                  "elementSize == sizeof(uint32)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_7 = 0; i_7 < length; i_7 = i_7 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_7,scriptContext);
      if (uVar11 < (ulong)(i_7 + 1) << 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2936,"((i + 1) * sizeof(uint32) <= allocSize)",
                                    "(i + 1) * sizeof(uint32) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      uVar7 = JavascriptConversion::ToUInt32(pvVar15,scriptContext);
      *(uint32 *)(buffer + (ulong)i_7 * 4) = uVar7;
    }
    break;
  case JsInt64Type:
    if (elementSize != 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x293b,"(elementSize == sizeof(int64))",
                                  "elementSize == sizeof(int64)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_8 = 0; i_8 < length; i_8 = i_8 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_8,scriptContext);
      if (uVar11 < (ulong)(i_8 + 1) << 3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x293f,"((i + 1) * sizeof(int64) <= allocSize)",
                                    "(i + 1) * sizeof(int64) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      lVar13 = JavascriptConversion::ToInt64(pvVar15,scriptContext);
      *(long *)(buffer + (ulong)i_8 * 8) = lVar13;
    }
    break;
  case JsUint64Type:
    if (elementSize != 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2944,"(elementSize == sizeof(uint64))",
                                  "elementSize == sizeof(uint64)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_9 = 0; i_9 < length; i_9 = i_9 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_9,scriptContext);
      if (uVar11 < (ulong)(i_9 + 1) << 3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2948,"((i + 1) * sizeof(uint64) <= allocSize)",
                                    "(i + 1) * sizeof(uint64) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      uVar14 = JavascriptConversion::ToUInt64(pvVar15,scriptContext);
      *(unsigned_long *)(buffer + (ulong)i_9 * 8) = uVar14;
    }
    break;
  case JsFloatType:
    if (elementSize != 4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x294d,"(elementSize == sizeof(float))",
                                  "elementSize == sizeof(float)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (i_10 = 0; i_10 < length; i_10 = i_10 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,i_10,scriptContext);
      if (uVar11 < (ulong)(i_10 + 1) << 2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2951,"((i + 1) * sizeof(float) <= allocSize)",
                                    "(i + 1) * sizeof(float) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      fVar17 = JavascriptConversion::ToFloat(pvVar15,scriptContext);
      *(float *)(buffer + (ulong)i_10 * 4) = fVar17;
    }
    break;
  case JsDoubleType:
    if (elementSize != 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x2956,"(elementSize == sizeof(double))",
                                  "elementSize == sizeof(double)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (local_68 = 0; local_68 < length; local_68 = local_68 + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>(arrayObject,local_68,scriptContext);
      if (uVar11 < (ulong)(local_68 + 1) << 3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x295a,"((i + 1) * sizeof(double) <= allocSize)",
                                    "(i + 1) * sizeof(double) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      dVar18 = JavascriptConversion::ToNumber(pvVar15,scriptContext);
      *(double *)(buffer + (ulong)local_68 * 8) = dVar18;
    }
    break;
  case JsNativeStringType:
    if (elementSize != 0x10) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x295f,"(elementSize == sizeof(JsNativeString))",
                                  "elementSize == sizeof(JsNativeString)");
      if (!bVar4) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    for (string._4_4_ = 0; string._4_4_ < length; string._4_4_ = string._4_4_ + 1) {
      pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                          (arrayObject,string._4_4_,scriptContext);
      if (uVar11 < (ulong)(string._4_4_ + 1) << 4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2963,"((i + 1) * sizeof(JsNativeString) <= allocSize)",
                                    "(i + 1) * sizeof(JsNativeString) <= allocSize");
        if (!bVar4) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      this = JavascriptConversion::ToString(pvVar15,scriptContext);
      iVar9 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x65])();
      *(ulong *)(buffer + (ulong)string._4_4_ * 0x10 + 8) = CONCAT44(extraout_var,iVar9);
      cVar10 = JavascriptString::GetLength(this);
      *(charcount_t *)(buffer + (ulong)string._4_4_ * 0x10) = cVar10;
    }
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x296a,"(0)","FALSE");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  return;
}

Assistant:

void JavascriptOperators::ObjectToNativeArray(T* arrayObject,
        JsNativeValueType valueType,
        __in UINT length,
        __in UINT elementSize,
        __out_bcount(length*elementSize) byte* buffer,
        Js::ScriptContext* scriptContext)
    {
        Var element;
        uint64 allocSize = UInt32Math::Mul(length, elementSize);

        // TODO:further fast path the call for things like IntArray convert to int, floatarray convert to float etc.
        // such that we don't need boxing.
        switch (valueType)
        {
        case JsInt8Type:
            AnalysisAssert(elementSize == sizeof(int8));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int8) <= allocSize);
#pragma prefast(suppress:22102)
                ((int8*)buffer)[i] = Js::JavascriptConversion::ToInt8(element, scriptContext);
            }
            break;
        case JsUint8Type:
            AnalysisAssert(elementSize == sizeof(uint8));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint8) <= allocSize);
                ((uint8*)buffer)[i] = Js::JavascriptConversion::ToUInt8(element, scriptContext);
            }
            break;
        case JsInt16Type:
            AnalysisAssert(elementSize == sizeof(int16));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int16) <= allocSize);
                ((int16*)buffer)[i] = Js::JavascriptConversion::ToInt16(element, scriptContext);
            }
            break;
        case JsUint16Type:
            AnalysisAssert(elementSize == sizeof(uint16));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint16) <= allocSize);
                ((uint16*)buffer)[i] = Js::JavascriptConversion::ToUInt16(element, scriptContext);
            }
            break;
        case JsInt32Type:
            AnalysisAssert(elementSize == sizeof(int32));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int32) <= allocSize);
                ((int32*)buffer)[i] = Js::JavascriptConversion::ToInt32(element, scriptContext);
            }
            break;
        case JsUint32Type:
            AnalysisAssert(elementSize == sizeof(uint32));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint32) <= allocSize);
                ((uint32*)buffer)[i] = Js::JavascriptConversion::ToUInt32(element, scriptContext);
            }
            break;
        case JsInt64Type:
            AnalysisAssert(elementSize == sizeof(int64));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int64) <= allocSize);
                ((int64*)buffer)[i] = Js::JavascriptConversion::ToInt64(element, scriptContext);
            }
            break;
        case JsUint64Type:
            AnalysisAssert(elementSize == sizeof(uint64));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint64) <= allocSize);
                ((uint64*)buffer)[i] = Js::JavascriptConversion::ToUInt64(element, scriptContext);
            }
            break;
        case JsFloatType:
            AnalysisAssert(elementSize == sizeof(float));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(float) <= allocSize);
                ((float*)buffer)[i] = Js::JavascriptConversion::ToFloat(element, scriptContext);
            }
            break;
        case JsDoubleType:
            AnalysisAssert(elementSize == sizeof(double));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(double) <= allocSize);
                ((double*)buffer)[i] = Js::JavascriptConversion::ToNumber(element, scriptContext);
            }
            break;
        case JsNativeStringType:
            AnalysisAssert(elementSize == sizeof(JsNativeString));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(JsNativeString) <= allocSize);
                Js::JavascriptString* string = Js::JavascriptConversion::ToString(element, scriptContext);
                (((JsNativeString*)buffer)[i]).str = string->GetSz();
                (((JsNativeString*)buffer)[i]).length = string->GetLength();
            }
            break;
        default:
            Assert(FALSE);
        }
    }